

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QPolygonF * __thiscall
QGraphicsItem::mapToItem
          (QPolygonF *__return_storage_ptr__,QGraphicsItem *this,QGraphicsItem *item,QRectF *rect)

{
  long in_FS_OFFSET;
  QPolygonF local_90;
  QTransform local_78;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      mapToScene(__return_storage_ptr__,this,rect);
      return __return_storage_ptr__;
    }
  }
  else {
    itemTransform(&local_78,this,item,(bool *)0x0);
    QPolygonF::QPolygonF(&local_90,rect);
    QTransform::map(__return_storage_ptr__);
    if (&(local_90.super_QList<QPointF>.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
      ._M_i = ((local_90.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.super_QList<QPointF>.d.d)->super_QArrayData,0x10,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapToItem(const QGraphicsItem *item, const QRectF &rect) const
{
    if (item)
        return itemTransform(item).map(rect);
    return mapToScene(rect);
}